

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar4;
  Fad<double> *pFVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  ulong uVar10;
  value_type vVar11;
  
  pFVar3 = (fadexpr->fadexpr_).left_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  uVar1 = (((pFVar4->fadexpr_).left_)->dx_).num_elts;
  uVar2 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (((pFVar3->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 <= (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar2 != uVar1) {
    if (uVar2 == 0) {
      if (uVar1 != 0) {
        pdVar9 = (this->dx_).ptr_to_data;
        if (pdVar9 != (double *)0x0) {
          operator_delete__(pdVar9);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar1 != 0) {
        pdVar9 = (this->dx_).ptr_to_data;
        if (pdVar9 != (double *)0x0) {
          operator_delete__(pdVar9);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar2;
      uVar10 = 0xffffffffffffffff;
      if (-1 < (int)uVar2) {
        uVar10 = (long)(int)uVar2 << 3;
      }
      pdVar9 = (double *)operator_new__(uVar10);
      (this->dx_).ptr_to_data = pdVar9;
    }
  }
  if (uVar2 != 0) {
    pdVar9 = (this->dx_).ptr_to_data;
    pFVar3 = (fadexpr->fadexpr_).left_;
    pFVar4 = (pFVar3->fadexpr_).left_;
    pFVar5 = (pFVar4->fadexpr_).left_;
    if ((((pFVar5->dx_).num_elts == 0) || ((((pFVar4->fadexpr_).right_)->dx_).num_elts == 0)) ||
       ((((pFVar3->fadexpr_).right_)->dx_).num_elts == 0)) {
      if (0 < (int)uVar2) {
        uVar10 = 0;
        do {
          vVar11 = FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>
                   ::dx(&fadexpr->fadexpr_,(int)uVar10);
          pdVar9[uVar10] = vVar11;
          uVar10 = uVar10 + 1;
        } while (uVar2 != uVar10);
      }
    }
    else if (0 < (int)uVar2) {
      pdVar6 = *(double **)((long)&pFVar5->dx_ + 8);
      pdVar7 = (((pFVar4->fadexpr_).right_)->dx_).ptr_to_data;
      pdVar8 = (((pFVar3->fadexpr_).right_)->dx_).ptr_to_data;
      uVar10 = 0;
      do {
        pdVar9[uVar10] =
             (pdVar6[uVar10] + pdVar7[uVar10] + pdVar8[uVar10]) /
             (fadexpr->fadexpr_).right_.constant_;
        uVar10 = uVar10 + 1;
      } while (uVar2 != uVar10);
    }
  }
  pFVar3 = (fadexpr->fadexpr_).left_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  this->val_ = (((pFVar4->fadexpr_).left_)->val_ + ((pFVar4->fadexpr_).right_)->val_ +
               ((pFVar3->fadexpr_).right_)->val_) / (fadexpr->fadexpr_).right_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}